

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects::InternalSwap
          (VisionFeaturePrint_Objects *this,VisionFeaturePrint_Objects *other)

{
  int iVar1;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->output_).super_RepeatedPtrFieldBase,
             &(other->output_).super_RepeatedPtrFieldBase);
  iVar1 = this->version_;
  this->version_ = other->version_;
  other->version_ = iVar1;
  iVar1 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar1;
  return;
}

Assistant:

void VisionFeaturePrint_Objects::InternalSwap(VisionFeaturePrint_Objects* other) {
  output_.InternalSwap(&other->output_);
  std::swap(version_, other->version_);
  std::swap(_cached_size_, other->_cached_size_);
}